

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmpseq.c
# Opt level: O2

void cmpseq(seqdiff_results_t *results)

{
  sd_lookup_t *psVar1;
  int iVar2;
  gzFile pgVar3;
  kseq_t *pkVar4;
  sd_lookup_t *psVar5;
  char *pcVar6;
  FILE *fp;
  sd_lookup_t *psVar7;
  
  pgVar3 = (gzFile)gzopen(results->first_file,"r");
  if (pgVar3 == (gzFile)0x0) {
    pcVar6 = results->first_file;
  }
  else {
    pkVar4 = kseq_init(pgVar3);
    while (iVar2 = kseq_read(pkVar4), -1 < iVar2) {
      results->first_file_total = results->first_file_total + 1;
      sd_add_seq(pkVar4,1,results->use_header);
    }
    kseq_destroy(pkVar4);
    gzclose(pgVar3);
    pgVar3 = (gzFile)gzopen(results->second_file,"r");
    if (pgVar3 != (gzFile)0x0) {
      pkVar4 = kseq_init(pgVar3);
      while (iVar2 = kseq_read(pkVar4), -1 < iVar2) {
        results->second_file_total = results->second_file_total + 1;
        sd_add_seq(pkVar4,2,results->use_header);
      }
      kseq_destroy(pkVar4);
      gzclose(pgVar3);
      psVar7 = sd_lookup;
      if (sd_lookup == (sd_lookup_t *)0x0) {
        psVar1 = (sd_lookup_t *)0x0;
      }
      else {
        psVar1 = (sd_lookup_t *)(sd_lookup->hh).next;
      }
      do {
        psVar5 = psVar1;
        if (psVar7 == (sd_lookup_t *)0x0) {
          sd_delete_hash();
          return;
        }
        if (psVar7->in_a == 0) {
          if (psVar7->in_b == 1) {
            results->second_file_uniq = results->second_file_uniq + 1;
            if (results->only_summarize == 0) {
              fprintf(_stdout,"\t%s\n",psVar7->name);
            }
            fp = results->b_output_fp;
            goto LAB_00101a78;
          }
        }
        else if (psVar7->in_a == 1) {
          if (psVar7->in_b == 1) {
            results->common = results->common + 1;
            if (results->only_summarize == 0) {
              fprintf(_stdout,"%s\t%s\n",psVar7->name);
            }
            fp = results->c_output_fp;
          }
          else {
            if (psVar7->in_b != 0) goto LAB_00101a91;
            results->first_file_uniq = results->first_file_uniq + 1;
            if (results->only_summarize == 0) {
              fprintf(_stdout,"%s\t\n",psVar7->name);
            }
            fp = results->a_output_fp;
          }
LAB_00101a78:
          if (fp != (FILE *)0x0) {
            print_fasta(fp,psVar7->name,psVar7->comment,psVar7->seq,0x32);
          }
        }
LAB_00101a91:
        psVar1 = (sd_lookup_t *)0x0;
        psVar7 = psVar5;
        if (psVar5 != (sd_lookup_t *)0x0) {
          psVar1 = (sd_lookup_t *)(psVar5->hh).next;
        }
      } while( true );
    }
    pcVar6 = results->second_file;
  }
  fprintf(_stderr,"%s - Couldn\'t open fasta file %s\n",progname,pcVar6);
  exit(1);
}

Assistant:

void cmpseq(seqdiff_results_t *results) {
	gzFile fp;
	int l;
	kseq_t *seq;
	sd_lookup_t *s,*temp;

	/* open first sequence file */
	fp = gzopen(results->first_file,"r");
	if (!fp) {
		fprintf(stderr,"%s - Couldn't open fasta file %s\n",progname,results->first_file);
		exit(EXIT_FAILURE);
	}

	seq = kseq_init(fp); /* initialize kseq */
	
	while((l = kseq_read(seq)) >= 0) {
		results->first_file_total++; /* increment first_file_total */
		sd_add_seq(seq,1,results->use_header);
	}

	kseq_destroy(seq);
	gzclose(fp); /* done reading file */

	/* process second_file */
	fp = gzopen(results->second_file,"r");
	if (!fp) {
		fprintf(stderr,"%s - Couldn't open fasta file %s\n",progname,results->second_file);
		exit(EXIT_FAILURE);
	}

	seq = kseq_init(fp); /* initialize kseq */
	
	while((l = kseq_read(seq)) >= 0) {
		results->second_file_total++; /* increment second_file_total */
		sd_add_seq(seq,2,results->use_header);
	}

	kseq_destroy(seq); /* free kseq struct */
	gzclose(fp); /* done reading file */

	HASH_ITER(hh, sd_lookup, s, temp) {
		if (s->in_a == 1 && s->in_b == 0) {
			results->first_file_uniq++;
			if (!results->only_summarize)
				fprintf(stdout,"%s\t\n",s->name);
			/* printing out fasta or fastq????? */
			if (results->a_output_fp != NULL)
				print_fasta(results->a_output_fp, s->name, s->comment, s->seq, 50);
		} else if (s->in_a == 0 && s->in_b == 1) {
			results->second_file_uniq++;
			if (!results->only_summarize)
				fprintf(stdout,"\t%s\n",s->name);
			if (results->b_output_fp != NULL)
				print_fasta(results->b_output_fp, s->name, s->comment, s->seq, 50);
		} else if (s->in_a == 1 && s->in_b == 1) {
			results->common++;
			if (!results->only_summarize)
				fprintf(stdout,"%s\t%s\n",s->name,s->name);
			if (results->c_output_fp != NULL) {
				print_fasta(results->c_output_fp, s->name, s->comment, s->seq, 50);
			}
		}
	}

	sd_delete_hash(); /* free the hash nodes */
}